

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ListOverlay.cpp
# Opt level: O1

void __thiscall cursespp::ListOverlay::RecalculateSize(ListOverlay *this)

{
  element_type *peVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  if (this->setWidthPercent < 1) {
    iVar2 = 0x1a;
    if (0 < this->setWidth) {
      iVar2 = this->setWidth;
    }
  }
  else {
    iVar2 = Screen::GetWidth();
    iVar2 = (int)((float)iVar2 * ((float)this->setWidthPercent / 100.0));
  }
  this->width = iVar2;
  this->height = 4;
  iVar2 = Screen::GetHeight();
  peVar1 = (this->adapter).super___shared_ptr<cursespp::IScrollAdapter,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (peVar1 != (element_type *)0x0) {
    iVar3 = (*peVar1->_vptr_IScrollAdapter[3])();
    iVar4 = iVar3 + 4;
    if (iVar2 + -4 <= iVar3 + 4) {
      iVar4 = iVar2 + -4;
    }
    this->height = iVar4;
  }
  iVar4 = Screen::GetHeight();
  iVar2 = iVar4 + -4;
  if (this->height < iVar4 + -4) {
    iVar2 = this->height;
  }
  if (iVar2 < 1) {
    iVar2 = 0;
  }
  this->height = iVar2;
  iVar4 = Screen::GetWidth();
  iVar2 = iVar4 + -4;
  if (this->width < iVar4 + -4) {
    iVar2 = this->width;
  }
  if (iVar2 < 1) {
    iVar2 = 0;
  }
  this->width = iVar2;
  this->y = 2;
  iVar2 = Screen::GetWidth();
  this->x = iVar2 / 2 - this->width / 2;
  return;
}

Assistant:

void ListOverlay::RecalculateSize() {
    if (this->setWidthPercent > 0) {
        int cx = Screen::GetWidth();
        this->width = (int)((this->setWidthPercent / 100.0f) * cx);
    }
    else {
        this->width = this->setWidth > 0 ? this->setWidth : DEFAULT_WIDTH;
    }

    this->height = 4; /* top frame + text + space + bottom frame */
    const int maxHeight = Screen::GetHeight() - 4;

    if (this->adapter) {
        this->height = std::min(
            maxHeight,
            (int) (4 + this->adapter->GetEntryCount()));
    }

    /* constrain to app bounds */
    this->height = std::max(0, std::min(Screen::GetHeight() - 4, this->height));
    this->width = std::max(0, std::min(Screen::GetWidth() - 4, this->width));

    this->y = VERTICAL_PADDING;
    this->x = (Screen::GetWidth() / 2) - (this->width / 2);
}